

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O1

double inform_shannon_cross(inform_dist *p,inform_dist *q,double base)

{
  uint64_t uVar1;
  uint uVar2;
  _Bool _Var3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  _Var3 = inform_dist_is_valid(p);
  dVar5 = NAN;
  if (_Var3) {
    _Var3 = inform_dist_is_valid(q);
    if (_Var3) {
      dVar5 = NAN;
      if (p->size == q->size) {
        if (p->size == 0) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = 0.0;
          uVar4 = 0;
          do {
            uVar2 = p->histogram[uVar4];
            if ((uVar2 != 0) || (q->histogram[uVar4] != 0)) {
              uVar1 = p->counts;
              dVar6 = log2((double)q->histogram[uVar4] /
                           (((double)CONCAT44(0x45300000,(int)(q->counts >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)q->counts) - 4503599627370496.0)));
              dVar5 = dVar5 - dVar6 * ((double)uVar2 /
                                      (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                                       1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)
                                      ));
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < p->size);
        }
        dVar6 = log2(base);
        dVar5 = dVar5 / dVar6;
      }
    }
    else {
      dVar5 = NAN;
    }
  }
  return dVar5;
}

Assistant:

double inform_shannon_cross(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double ce = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 || q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                ce -= u * log2(v);
            }
        }
        return ce / log2(base);
    }
    return NAN;
}